

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

int stbir_resize_extended(STBIR_RESIZE *resize)

{
  int iVar1;
  int iVar2;
  int alloc_state;
  int result;
  STBIR_RESIZE *resize_local;
  
  if ((resize->samplers == (stbir__info *)0x0) || (resize->needs_rebuild != 0)) {
    iVar2 = resize->called_alloc;
    if (resize->samplers != (stbir__info *)0x0) {
      stbir__free_internal_mem(resize->samplers);
      resize->samplers = (stbir__info *)0x0;
    }
    iVar1 = stbir_build_samplers(resize);
    if (iVar1 == 0) {
      return 0;
    }
    resize->called_alloc = iVar2;
    if (resize->samplers == (stbir__info *)0x0) {
      return 1;
    }
  }
  iVar2 = stbir__perform_resize(resize->samplers,0,resize->splits);
  if (resize->called_alloc == 0) {
    stbir_free_samplers(resize);
    resize->samplers = (stbir__info *)0x0;
  }
  return iVar2;
}

Assistant:

STBIRDEF int stbir_resize_extended( STBIR_RESIZE * resize )
{
  int result;

  if ( ( resize->samplers == 0 ) || ( resize->needs_rebuild ) )
  {
    int alloc_state = resize->called_alloc;  // remember allocated state

    if ( resize->samplers )
    {
      stbir__free_internal_mem( resize->samplers );
      resize->samplers = 0;
    }

    if ( !stbir_build_samplers( resize ) )
      return 0;

    resize->called_alloc = alloc_state;

    // if build_samplers succeeded (above), but there are no samplers set, then
    //   the area to stretch into was zero pixels, so don't do anything and return
    //   success
    if ( resize->samplers == 0 )
      return 1;
  }
  else
  {
    // didn't build anything - clear it
    STBIR_PROFILE_BUILD_CLEAR( resize->samplers );
  }

  // do resize
  result = stbir__perform_resize( resize->samplers, 0, resize->splits );

  // if we alloced, then free
  if ( !resize->called_alloc )
  {
    stbir_free_samplers( resize );
    resize->samplers = 0;
  }

  return result;
}